

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# InstructionTreeVm.cpp
# Opt level: O1

VmValue * CompileVmFunctionCall(ExpressionContext *ctx,VmModule *module,ExprFunctionCall *node)

{
  VmValueType VVar1;
  VmInstructionType cmd;
  TypeBase *type;
  Allocator *pAVar2;
  SynBase *pSVar3;
  VariableData *pVVar4;
  VmConstant **ppVVar5;
  bool bVar6;
  int iVar7;
  VmValue *argument;
  VmConstant *pVVar8;
  undefined4 extraout_var;
  VmInstruction *argument_00;
  VmInstruction *this;
  ExprBase *pEVar9;
  VmInstruction *argument_01;
  VmValue *argument_02;
  uint uVar10;
  VmValue *pVVar11;
  VmType VVar12;
  undefined4 extraout_var_00;
  
  argument = CompileVm(ctx,module,node->function);
  if (module->currentBlock == (VmBlock *)0x0) {
    __assert_fail("module->currentBlock",
                  "/workspace/llm4binary/github/license_c_cmakelists/WheretIB[P]nullc/NULLC/InstructionTreeVm.cpp"
                  ,0xe7d,
                  "VmValue *CompileVmFunctionCall(ExpressionContext &, VmModule *, ExprFunctionCall *)"
                 );
  }
  type = (node->super_ExprBase).type;
  if (type->size < 0x41) {
    argument_00 = (VmInstruction *)CreateConstantInt(ctx->allocator,(node->super_ExprBase).source,0)
    ;
  }
  else {
    pVVar8 = anon_unknown.dwarf_13465d::CreateAlloca
                       (ctx,module,(node->super_ExprBase).source,type,"spill",true);
    iVar7 = (*module->allocator->_vptr_Allocator[2])(module->allocator,0xd8);
    argument_00 = (VmInstruction *)CONCAT44(extraout_var,iVar7);
    pAVar2 = ctx->allocator;
    VVar12 = GetVmType(ctx,(node->super_ExprBase).type);
    pSVar3 = (node->super_ExprBase).source;
    (argument_00->super_VmValue).typeID = 1;
    (argument_00->super_VmValue).type = VVar12;
    (argument_00->super_VmValue).source = pSVar3;
    (argument_00->super_VmValue).comment.begin = (char *)0x0;
    (argument_00->super_VmValue).comment.end = (char *)0x0;
    (argument_00->super_VmValue).users.allocator = pAVar2;
    (argument_00->super_VmValue).users.data = (argument_00->super_VmValue).users.little;
    (argument_00->super_VmValue).users.count = 0;
    (argument_00->super_VmValue).users.max = 8;
    (argument_00->super_VmValue).hasSideEffects = false;
    (argument_00->super_VmValue).hasMemoryAccess = false;
    (argument_00->super_VmValue).canBeRemoved = true;
    (argument_00->super_VmValue).hasKnownSimpleUse = false;
    (argument_00->super_VmValue).hasKnownNonSimpleUse = false;
    (argument_00->super_VmValue)._vptr_VmValue = (_func_int **)&PTR__VmValue_00249d38;
    argument_00->cmd = VM_INST_LOAD_BYTE;
    (argument_00->arguments).little[2] = (VmValue *)0x0;
    (argument_00->arguments).little[3] = (VmValue *)0x0;
    (argument_00->arguments).little[0] = (VmValue *)0x0;
    (argument_00->arguments).little[1] = (VmValue *)0x0;
    (argument_00->arguments).data = (VmValue **)0x0;
    (argument_00->arguments).count = 0;
    (argument_00->arguments).max = 0;
    *(undefined2 *)&(argument_00->arguments).allocator = 0;
    argument_00->cmd = pVVar8->iValue;
    pVVar4 = pVVar8->container;
    (argument_00->arguments).little[3] = (VmValue *)pVVar4;
    *(bool *)((long)&(argument_00->arguments).allocator + 1) = true;
    uVar10 = (pVVar4->users).count;
    if (uVar10 == (pVVar4->users).max) {
      SmallArray<VmConstant_*,_8U>::grow(&pVVar4->users,uVar10);
    }
    ppVVar5 = (pVVar4->users).data;
    if (ppVVar5 == (VmConstant **)0x0) {
      __assert_fail("data",
                    "/workspace/llm4binary/github/license_c_cmakelists/WheretIB[P]nullc/NULLC/Array.h"
                    ,0x162,
                    "void SmallArray<VmConstant *, 8>::push_back(const T &) [T = VmConstant *, N = 8]"
                   );
    }
    uVar10 = (pVVar4->users).count;
    (pVVar4->users).count = uVar10 + 1;
    ppVVar5[uVar10] = (VmConstant *)argument_00;
  }
  iVar7 = (*module->allocator->_vptr_Allocator[2])(module->allocator,0x138);
  this = (VmInstruction *)CONCAT44(extraout_var_00,iVar7);
  pAVar2 = module->allocator;
  VVar12 = GetVmType(ctx,(node->super_ExprBase).type);
  pSVar3 = (node->super_ExprBase).source;
  uVar10 = module->currentFunction->nextInstructionId;
  module->currentFunction->nextInstructionId = uVar10 + 1;
  VmInstruction::VmInstruction(this,pAVar2,VVar12,pSVar3,VM_INST_CALL,uVar10);
  if ((argument == (VmValue *)0x0) || (pVVar11 = argument, argument->typeID != 2)) {
    pVVar11 = (VmValue *)0x0;
  }
  if (((pVVar11 == (VmValue *)0x0) || (*(int *)&pVVar11[1]._vptr_VmValue != 0x49)) ||
     ((pVVar11->type).type != VM_TYPE_FUNCTION_REF)) {
    pVVar11 = (VmValue *)0x0;
    argument_02 = (VmValue *)0x0;
  }
  else {
    VVar1 = pVVar11[1].type.type;
    if ((VVar1 == VM_TYPE_VOID) || (VVar1 == VM_TYPE_INT)) {
      __assert_fail("index < count",
                    "/workspace/llm4binary/github/license_c_cmakelists/WheretIB[P]nullc/NULLC/Array.h"
                    ,0x199,
                    "T &SmallArray<VmValue *, 4>::operator[](unsigned int) [T = VmValue *, N = 4]");
    }
    argument_02 = (VmValue *)**(undefined8 **)&pVVar11[1].typeID;
    pVVar11 = (VmValue *)(*(undefined8 **)&pVVar11[1].typeID)[1];
    if ((pVVar11 == (VmValue *)0x0) || (pVVar11->typeID != 4)) {
      pVVar11 = (VmValue *)0x0;
    }
  }
  uVar10 = (pVVar11 != (VmValue *)0x0 && argument_02 != (VmValue *)0x0) | 2;
  for (pEVar9 = (node->arguments).head; pEVar9 != (ExprBase *)0x0; pEVar9 = pEVar9->next) {
    uVar10 = uVar10 + 1;
  }
  if ((this->arguments).max <= uVar10) {
    SmallArray<VmValue_*,_4U>::grow(&this->arguments,uVar10);
  }
  if (pVVar11 != (VmValue *)0x0 && argument_02 != (VmValue *)0x0) {
    VmInstruction::AddArgument(this,argument_02);
    argument = pVVar11;
  }
  VmInstruction::AddArgument(this,argument);
  VmInstruction::AddArgument(this,&argument_00->super_VmValue);
  pEVar9 = (node->arguments).head;
  while( true ) {
    if (pEVar9 == (ExprBase *)0x0) {
      cmd = this->cmd;
      bVar6 = anon_unknown.dwarf_13465d::HasSideEffects(cmd);
      (this->super_VmValue).hasSideEffects = bVar6;
      bVar6 = anon_unknown.dwarf_13465d::HasMemoryAccess(cmd);
      (this->super_VmValue).hasMemoryAccess = bVar6;
      VmBlock::AddInstruction(module->currentBlock,this);
      if (0x40 < ((node->super_ExprBase).type)->size) {
        this = argument_00;
      }
      anon_unknown.dwarf_13465d::CheckType(ctx,&node->super_ExprBase,&this->super_VmValue);
      return &this->super_VmValue;
    }
    argument_01 = (VmInstruction *)CompileVm(ctx,module,pEVar9);
    if ((argument_01->super_VmValue).type.size == 0 &&
        (argument_01->super_VmValue).type.type == VM_TYPE_VOID) break;
    if (pEVar9->type == ctx->typeFloat) {
      argument_01 = anon_unknown.dwarf_13465d::CreateInstruction
                              ((anon_unknown_dwarf_13465d *)module,
                               (VmModule *)(node->super_ExprBase).source,(SynBase *)0x400000001,
                               (VmType)(ZEXT816(0x11) << 0x40),(VmInstructionType)argument_01,
                               (VmValue *)0x0,(VmValue *)0x0,(VmValue *)0x0,(VmValue *)0x0,
                               &argument_00->super_VmValue);
    }
    VmInstruction::AddArgument(this,&argument_01->super_VmValue);
    pEVar9 = pEVar9->next;
  }
  __assert_fail("argument->type != VmType::Void",
                "/workspace/llm4binary/github/license_c_cmakelists/WheretIB[P]nullc/NULLC/InstructionTreeVm.cpp"
                ,0xebd,
                "VmValue *CompileVmFunctionCall(ExpressionContext &, VmModule *, ExprFunctionCall *)"
               );
}

Assistant:

VmValue* CompileVmFunctionCall(ExpressionContext &ctx, VmModule *module, ExprFunctionCall *node)
{
	VmValue *function = CompileVm(ctx, module, node->function);

	assert(module->currentBlock);

	VmValue *resultTarget = NULL;

	if(node->type->size > spillTypeSize)
	{
		VmConstant *spill = CreateAlloca(ctx, module, node->source, node->type, "spill", true);

		VmConstant *reference = new (module->get<VmConstant>()) VmConstant(ctx.allocator, GetVmType(ctx, node->type), node->source);

		reference->iValue = spill->iValue;
		reference->container = spill->container;
		reference->isReference = true;

		reference->container->users.push_back(reference);

		resultTarget = reference;
	}
	else
	{
		resultTarget = CreateConstantInt(ctx.allocator, node->source, 0);
	}

	VmInstruction *inst = new (module->get<VmInstruction>()) VmInstruction(module->allocator, GetVmType(ctx, node->type), node->source, VM_INST_CALL, module->currentFunction->nextInstructionId++);

	// Inline call target for instruction without context
	VmValue *functionContext = NULL;
	VmFunction *functionId = NULL;

	if(VmInstruction *target = getType<VmInstruction>(function))
	{
		if(target->cmd == VM_INST_CONSTRUCT && target->type.type == VM_TYPE_FUNCTION_REF)
		{
			functionContext = target->arguments[0];
			functionId = getType<VmFunction>(target->arguments[1]);
		}
	}

	unsigned argCount = 2;

	if(functionContext && functionId)
		argCount++;

	for(ExprBase *value = node->arguments.head; value; value = value->next)
		argCount++;

	inst->arguments.reserve(argCount);

	if(functionContext && functionId)
	{
		inst->AddArgument(functionContext);
		inst->AddArgument(functionId);
	}
	else
	{
		inst->AddArgument(function);
	}

	inst->AddArgument(resultTarget);

	for(ExprBase *value = node->arguments.head; value; value = value->next)
	{
		VmValue *argument = CompileVm(ctx, module, value);

		assert(argument->type != VmType::Void);

		if(value->type == ctx.typeFloat)
			argument = CreateInstruction(module, node->source, VmType::Int, VM_INST_DOUBLE_TO_FLOAT, argument);

		inst->AddArgument(argument);
	}

	inst->hasSideEffects = HasSideEffects(inst->cmd);
	inst->hasMemoryAccess = HasMemoryAccess(inst->cmd);

	module->currentBlock->AddInstruction(inst);

	if(node->type->size > spillTypeSize)
		return CheckType(ctx, node, resultTarget);

	return CheckType(ctx, node, inst);
}